

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * cmGlobalNinjaMultiGenerator::GetNinjaImplFilename
                   (string *__return_storage_ptr__,string *config)

{
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  string *local_18;
  string *config_local;
  
  local_18 = config;
  config_local = __return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_48,"CMakeFiles/impl-");
  cmAlphaNum::cmAlphaNum(&local_78,local_18);
  cmStrCat<char_const*>(__return_storage_ptr__,&local_48,&local_78,&NINJA_FILE_EXTENSION);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaMultiGenerator::GetNinjaImplFilename(
  const std::string& config)
{
  return cmStrCat("CMakeFiles/impl-", config,
                  cmGlobalNinjaMultiGenerator::NINJA_FILE_EXTENSION);
}